

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O3

char * lj_str_pushvf(lua_State *L,char *fmt,__va_list_tag *argp)

{
  SBuf *sb;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  char *pcVar6;
  uint *puVar7;
  long *plVar8;
  cTValue *pcVar9;
  int *piVar10;
  ulong *puVar11;
  size_t sVar12;
  ulong uVar13;
  GCstr *pGVar14;
  TValue *pTVar15;
  MSize MVar16;
  ulong uVar17;
  int c;
  uint uVar18;
  byte *pbVar19;
  char *s;
  ulong uVar20;
  TValue tv;
  char buf [11];
  cTValue local_60;
  undefined2 local_58 [4];
  byte local_4f [31];
  
  uVar20 = (ulong)(L->glref).ptr32;
  sVar4 = strlen(fmt);
  uVar3 = (uint)sVar4;
  if (*(uint *)(uVar20 + 100) < uVar3) {
    MVar16 = 0x20;
    if (0x20 < uVar3) {
      MVar16 = uVar3;
    }
    pvVar5 = lj_mem_realloc(L,*(void **)(uVar20 + 0x58),*(uint *)(uVar20 + 100),MVar16);
    *(void **)(uVar20 + 0x58) = pvVar5;
    *(MSize *)(uVar20 + 100) = MVar16;
  }
  sb = (SBuf *)(uVar20 + 0x58);
  *(undefined4 *)(uVar20 + 0x60) = 0;
  pcVar6 = strchr(fmt,0x25);
  do {
    if (pcVar6 == (char *)0x0) {
      sVar4 = strlen(fmt);
      addstr(L,sb,fmt,(MSize)sVar4);
      pTVar15 = L->top;
      pGVar14 = lj_str_new(L,*(char **)(uVar20 + 0x58),(ulong)*(uint *)(uVar20 + 0x60));
      (pTVar15->u32).lo = (uint32_t)pGVar14;
      (pTVar15->field_2).it = 0xfffffffb;
      pTVar15 = L->top + 1;
      L->top = pTVar15;
      if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar15) {
        lj_state_growstack(L,1);
        pTVar15 = L->top;
      }
      return (char *)((ulong)pTVar15[-1].u32.lo + 0x10);
    }
    addstr(L,sb,fmt,(int)pcVar6 - (int)fmt);
    bVar1 = pcVar6[1];
    if (bVar1 < 0x66) {
      if (bVar1 == 0x25) {
        c = 0x25;
      }
      else if (bVar1 == 99) {
        uVar3 = argp->gp_offset;
        if ((ulong)uVar3 < 0x29) {
          piVar10 = (int *)((ulong)uVar3 + (long)argp->reg_save_area);
          argp->gp_offset = uVar3 + 8;
        }
        else {
          piVar10 = (int *)argp->overflow_arg_area;
          argp->overflow_arg_area = piVar10 + 2;
        }
        c = *piVar10;
      }
      else {
        if (bVar1 == 100) {
          uVar3 = argp->gp_offset;
          if ((ulong)uVar3 < 0x29) {
            puVar7 = (uint *)((ulong)uVar3 + (long)argp->reg_save_area);
            argp->gp_offset = uVar3 + 8;
          }
          else {
            puVar7 = (uint *)argp->overflow_arg_area;
            argp->overflow_arg_area = puVar7 + 2;
          }
          uVar3 = *puVar7;
          uVar18 = -uVar3;
          if (0 < (int)uVar3) {
            uVar18 = uVar3;
          }
          pbVar19 = local_4f + 1;
          do {
            s = (char *)pbVar19;
            *s = (char)uVar18 + (char)(uVar18 / 10) * -10 | 0x30;
            pbVar19 = (byte *)s + -1;
            bVar2 = 9 < uVar18;
            uVar18 = uVar18 / 10;
          } while (bVar2);
          if ((int)uVar3 < 0) {
            *pbVar19 = 0x2d;
            s = (char *)pbVar19;
          }
          MVar16 = ((int)local_4f + 2) - (int)s;
          goto LAB_00109556;
        }
LAB_001093a2:
        addchar(L,sb,0x25);
        c = (int)pcVar6[1];
      }
      addchar(L,sb,c);
    }
    else {
      if (bVar1 == 0x66) {
        uVar3 = argp->fp_offset;
        if ((ulong)uVar3 < 0xa1) {
          pcVar9 = (cTValue *)((ulong)uVar3 + (long)argp->reg_save_area);
          argp->fp_offset = uVar3 + 0x10;
        }
        else {
          pcVar9 = (cTValue *)argp->overflow_arg_area;
          argp->overflow_arg_area = pcVar9 + 1;
        }
        local_60 = *pcVar9;
        s = (char *)local_58;
        sVar12 = lj_str_bufnum(s,&local_60);
        MVar16 = (MSize)sVar12;
      }
      else if (bVar1 == 0x70) {
        uVar3 = argp->gp_offset;
        if ((ulong)uVar3 < 0x29) {
          puVar11 = (ulong *)((ulong)uVar3 + (long)argp->reg_save_area);
          argp->gp_offset = uVar3 + 8;
        }
        else {
          puVar11 = (ulong *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar11 + 1;
        }
        uVar13 = *puVar11;
        if (uVar13 == 0) {
          s = "NULL";
          MVar16 = 4;
        }
        else {
          uVar17 = 10;
          if (uVar13 >> 0x20 != 0) {
            uVar3 = 0x1f;
            uVar18 = (uint)(uVar13 >> 0x20);
            if (uVar18 != 0) {
              for (; uVar18 >> uVar3 == 0; uVar3 = uVar3 - 1) {
              }
            }
            uVar17 = (ulong)((uVar3 >> 2 & 6) + 0xc);
          }
          MVar16 = (MSize)uVar17;
          local_58[0] = 0x7830;
          uVar17 = uVar17 + 1;
          do {
            *(char *)((long)local_58 + (uVar17 - 2)) = "0123456789abcdef"[(uint)uVar13 & 0xf];
            uVar13 = (long)uVar13 >> 4;
            uVar17 = uVar17 - 1;
          } while (3 < uVar17);
          s = (char *)local_58;
        }
      }
      else {
        if (bVar1 != 0x73) goto LAB_001093a2;
        uVar3 = argp->gp_offset;
        if ((ulong)uVar3 < 0x29) {
          plVar8 = (long *)((ulong)uVar3 + (long)argp->reg_save_area);
          argp->gp_offset = uVar3 + 8;
        }
        else {
          plVar8 = (long *)argp->overflow_arg_area;
          argp->overflow_arg_area = plVar8 + 1;
        }
        s = (char *)*plVar8;
        if ((byte *)s == (byte *)0x0) {
          s = "(null)";
        }
        sVar4 = strlen(s);
        MVar16 = (MSize)sVar4;
      }
LAB_00109556:
      addstr(L,sb,s,MVar16);
    }
    fmt = pcVar6 + 2;
    pcVar6 = strchr(fmt,0x25);
  } while( true );
}

Assistant:

const char *lj_str_pushvf(lua_State *L, const char *fmt, va_list argp)
{
  SBuf *sb = &G(L)->tmpbuf;
  lj_str_needbuf(L, sb, (MSize)strlen(fmt));
  lj_str_resetbuf(sb);
  for (;;) {
    const char *e = strchr(fmt, '%');
    if (e == NULL) break;
    addstr(L, sb, fmt, (MSize)(e-fmt));
    /* This function only handles %s, %c, %d, %f and %p formats. */
    switch (e[1]) {
    case 's': {
      const char *s = va_arg(argp, char *);
      if (s == NULL) s = "(null)";
      addstr(L, sb, s, (MSize)strlen(s));
      break;
      }
    case 'c':
      addchar(L, sb, va_arg(argp, int));
      break;
    case 'd': {
      char buf[LJ_STR_INTBUF];
      char *p = lj_str_bufint(buf, va_arg(argp, int32_t));
      addstr(L, sb, p, (MSize)(buf+LJ_STR_INTBUF-p));
      break;
      }
    case 'f': {
      char buf[LJ_STR_NUMBUF];
      TValue tv;
      MSize len;
      tv.n = (lua_Number)(va_arg(argp, LUAI_UACNUMBER));
      len = (MSize)lj_str_bufnum(buf, &tv);
      addstr(L, sb, buf, len);
      break;
      }
    case 'p': {
#define FMTP_CHARS	(2*sizeof(ptrdiff_t))
      char buf[2+FMTP_CHARS];
      ptrdiff_t p = (ptrdiff_t)(va_arg(argp, void *));
      ptrdiff_t i, lasti = 2+FMTP_CHARS;
      if (p == 0) {
	addstr(L, sb, "NULL", 4);
	break;
      }
#if LJ_64
      /* Shorten output for 64 bit pointers. */
      lasti = 2+2*4+((p >> 32) ? 2+2*(lj_fls((uint32_t)(p >> 32))>>3) : 0);
#endif
      buf[0] = '0';
      buf[1] = 'x';
      for (i = lasti-1; i >= 2; i--, p >>= 4)
	buf[i] = "0123456789abcdef"[(p & 15)];
      addstr(L, sb, buf, (MSize)lasti);
      break;
      }
    case '%':
      addchar(L, sb, '%');
      break;
    default:
      addchar(L, sb, '%');
      addchar(L, sb, e[1]);
      break;
    }
    fmt = e+2;
  }
  addstr(L, sb, fmt, (MSize)strlen(fmt));
  setstrV(L, L->top, lj_str_new(L, sb->buf, sb->n));
  incr_top(L);
  return strVdata(L->top - 1);
}